

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *address_list)

{
  bool bVar1;
  Script *this_00;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *in_RCX;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *in_RDI;
  Address *addr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__range1;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> locking_script_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  *in_stack_00000410;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_stack_00000418;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_00000420;
  uint32_t in_stack_0000042c;
  ConfidentialTransactionContext *in_stack_00000430;
  Script *__args;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
  local_78;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *local_70;
  undefined1 local_51 [81];
  
  local_51._49_8_ = in_RCX;
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)0x4085bf);
  this_00 = (Script *)
            std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                      ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                       local_51._49_8_);
  __args = (Script *)local_51;
  std::allocator<cfd::core::ConfidentialNonce>::allocator
            ((allocator<cfd::core::ConfidentialNonce> *)0x4085e3);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<cfd::core::ConfidentialNonce>::~allocator
            ((allocator<cfd::core::ConfidentialNonce> *)0x408609);
  local_70 = (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_51._49_8_;
  local_78._M_current =
       (Address *)
       std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::begin(in_RDI);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                        *)this_00,
                       (__normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
    ::operator*(&local_78);
    cfd::core::Address::GetLockingScript();
    std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::
    emplace_back<cfd::core::Script>
              ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
               in_stack_ffffffffffffff40,__args);
    core::Script::~Script(this_00);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
    ::operator++(&local_78);
  }
  SplitTxOut(in_stack_00000430,in_stack_0000042c,in_stack_00000420,in_stack_00000418,
             in_stack_00000410);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             in_stack_ffffffffffffff40);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             in_stack_ffffffffffffff40);
  return;
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Address>& address_list) {
  std::vector<Script> locking_script_list;
  std::vector<ConfidentialNonce> nonce_list(address_list.size());
  for (const auto& addr : address_list) {
    locking_script_list.emplace_back(addr.GetLockingScript());
  }
  SplitTxOut(index, amount_list, locking_script_list, nonce_list);
}